

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O1

void __thiscall
ArgumentParser::Instance::Bind
          (Instance *this,
          NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *val)

{
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  pcStack_20 = std::
               _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.cxx:82:5)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.cxx:82:5)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  local_38._8_8_ = val;
  std::function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  operator=(&this->KeywordValueFunc,
            (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
             *)&local_38);
  this->KeywordValuesExpected = 1;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void Instance::Bind(NonEmpty<std::string>& val)
{
  this->Bind(
    [this, &val](cm::string_view arg) -> Continue {
      if (arg.empty() && this->ParseResults) {
        this->ParseResults->AddKeywordError(this->Keyword,
                                            "  empty string not allowed\n");
      }
      val.assign(std::string(arg));
      return Continue::No;
    },
    ExpectAtLeast{ 1 });
}